

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor_function.hpp
# Opt level: O0

void asio::detail::executor_function::
     complete<asio::detail::binder0<asio::detail::binder1<std::function<void(std::error_code_const&)>,std::error_code>>,std::allocator<void>>
               (impl_base *base,bool call)

{
  byte in_SIL;
  binder0<asio::detail::binder1<std::function<void_(const_std::error_code_&)>,_std::error_code>_>
  function;
  ptr p;
  allocator<void> allocator;
  impl<asio::detail::binder0<asio::detail::binder1<std::function<void_(const_std::error_code_&)>,_std::error_code>_>,_std::allocator<void>_>
  *i;
  binder0<asio::detail::binder1<std::function<void_(const_std::error_code_&)>,_std::error_code>_>
  *in_stack_ffffffffffffff88;
  ptr *in_stack_ffffffffffffff90;
  
  binder0<asio::detail::binder1<std::function<void_(const_std::error_code_&)>,_std::error_code>_>::
  binder0((binder0<asio::detail::binder1<std::function<void_(const_std::error_code_&)>,_std::error_code>_>
           *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  impl<asio::detail::binder0<asio::detail::binder1<std::function<void_(const_std::error_code_&)>,_std::error_code>_>,_std::allocator<void>_>
  ::ptr::reset(in_stack_ffffffffffffff90);
  if ((in_SIL & 1) != 0) {
    binder0<asio::detail::binder1<std::function<void_(const_std::error_code_&)>,_std::error_code>_>
    ::operator()((binder0<asio::detail::binder1<std::function<void_(const_std::error_code_&)>,_std::error_code>_>
                  *)0x7db26c);
  }
  binder0<asio::detail::binder1<std::function<void_(const_std::error_code_&)>,_std::error_code>_>::
  ~binder0((binder0<asio::detail::binder1<std::function<void_(const_std::error_code_&)>,_std::error_code>_>
            *)0x7db2a4);
  impl<asio::detail::binder0<asio::detail::binder1<std::function<void_(const_std::error_code_&)>,_std::error_code>_>,_std::allocator<void>_>
  ::ptr::~ptr((ptr *)0x7db2ae);
  return;
}

Assistant:

static void complete(impl_base* base, bool call)
  {
    // Take ownership of the function object.
    impl<Function, Alloc>* i(static_cast<impl<Function, Alloc>*>(base));
    Alloc allocator(i->allocator_);
    typename impl<Function, Alloc>::ptr p = {
      detail::addressof(allocator), i, i };

    // Make a copy of the function so that the memory can be deallocated before
    // the upcall is made. Even if we're not about to make an upcall, a
    // sub-object of the function may be the true owner of the memory
    // associated with the function. Consequently, a local copy of the function
    // is required to ensure that any owning sub-object remains valid until
    // after we have deallocated the memory here.
    Function function(static_cast<Function&&>(i->function_));
    p.reset();

    // Make the upcall if required.
    if (call)
    {
      static_cast<Function&&>(function)();
    }
  }